

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_key.hpp
# Opt level: O2

data_ptr_t duckdb::ARTKey::CreateData<int>(ArenaAllocator *allocator,int value)

{
  uint *puVar1;
  
  puVar1 = (uint *)ArenaAllocator::Allocate(allocator,4);
  *puVar1 = (uint)value >> 0x18 | (value & 0xff0000U) >> 8 | (value & 0xff00U) << 8 | value << 0x18;
  *(data_t *)puVar1 = (char)((uint)value >> 0x18) + 0x80;
  return (data_ptr_t)puVar1;
}

Assistant:

static inline data_ptr_t CreateData(ArenaAllocator &allocator, T value) {
		auto data = allocator.Allocate(sizeof(value));
		Radix::EncodeData<T>(data, value);
		return data;
	}